

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

int yang_check_deviate_unique(lys_module *module,lys_deviate *deviate,lys_node *dev_target)

{
  char *value;
  int iVar1;
  long lVar2;
  lys_unique *plVar3;
  ulong uVar4;
  
  iVar1 = yang_read_deviate_unique(deviate,dev_target);
  uVar4 = 0;
  plVar3 = (lys_unique *)0x0;
  if (iVar1 == 0) {
    plVar3 = (lys_unique *)(dev_target[1].ext + (ulong)dev_target->padding[3] * 2);
    lVar2 = 0;
    for (uVar4 = 0; uVar4 < deviate->unique_size; uVar4 = uVar4 + 1) {
      value = *(char **)((long)&deviate->unique->expr + lVar2);
      if (deviate->mod == LY_DEVIATE_DEL) {
        iVar1 = yang_fill_unique(module,(lys_node_list *)dev_target,
                                 (lys_unique *)((long)&deviate->unique->expr + lVar2),value,
                                 (unres_schema *)0x0);
        if (iVar1 == 0) {
          iVar1 = yang_deviate_delete_unique
                            (module,deviate,(lys_node_list *)dev_target,(int)uVar4,value);
          if (iVar1 == 0) goto LAB_0014a07e;
        }
LAB_0014a0ad:
        free(value);
        goto LAB_0014a0b9;
      }
      if (deviate->mod == LY_DEVIATE_ADD) {
        iVar1 = yang_fill_unique(module,(lys_node_list *)dev_target,
                                 (lys_unique *)
                                 (dev_target[1].ext + (ulong)dev_target->padding[3] * 2),value,
                                 (unres_schema *)0x0);
        if (iVar1 != 0) goto LAB_0014a0ad;
        dev_target->padding[3] = dev_target->padding[3] + '\x01';
      }
LAB_0014a07e:
      free(value);
      lVar2 = lVar2 + 0x10;
    }
    iVar1 = 0;
    if (deviate->mod == LY_DEVIATE_ADD) {
      free(deviate->unique);
      deviate->unique = plVar3;
    }
  }
  else {
LAB_0014a0b9:
    iVar1 = 1;
    if (deviate->mod == LY_DEVIATE_ADD) {
      lVar2 = uVar4 << 4;
      while( true ) {
        uVar4 = uVar4 + 1;
        if (deviate->unique_size <= uVar4) break;
        free(*(void **)((long)&deviate->unique[1].expr + lVar2));
        lVar2 = lVar2 + 0x10;
      }
      free(deviate->unique);
      deviate->unique = plVar3;
    }
  }
  return iVar1;
}

Assistant:

int yang_check_deviate_unique(struct lys_module *module, struct lys_deviate *deviate, struct lys_node *dev_target)
{
    struct lys_node_list *list;
    char *str;
    uint i = 0;
    struct lys_unique *last_unique = NULL;

    if (yang_read_deviate_unique(deviate, dev_target)) {
        goto error;
    }
    list = (struct lys_node_list *)dev_target;
    last_unique = &list->unique[list->unique_size];
    for (i = 0; i < deviate->unique_size; ++i) {
        str = (char *) deviate->unique[i].expr;
        if (deviate->mod == LY_DEVIATE_ADD) {
            if (yang_fill_unique(module, list, &list->unique[list->unique_size], str, NULL)) {
                free(str);
                goto error;
            }
            list->unique_size++;
        } else if (deviate->mod == LY_DEVIATE_DEL) {
            if (yang_fill_unique(module, list, &deviate->unique[i], str, NULL)) {
                free(str);
                goto error;
            }
            if (yang_deviate_delete_unique(module, deviate, list, i, str)) {
                free(str);
                goto error;
            }
        }
        free(str);
    }
    if (deviate->mod == LY_DEVIATE_ADD) {
        free(deviate->unique);
        deviate->unique = last_unique;
    }


    return EXIT_SUCCESS;
error:
    if (deviate->mod == LY_DEVIATE_ADD) {
        for (i = i + 1; i < deviate->unique_size; ++i) {
            free(deviate->unique[i].expr);
        }
        free(deviate->unique);
        deviate->unique = last_unique;

    }
    return EXIT_FAILURE;
}